

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O3

void cmUVPipeBuffer::UVData(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  cmUVPipeBuffer *this;
  _Manager_type p_Var1;
  _Invoker_type p_Var2;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  ssize_t local_20;
  
  this = (cmUVPipeBuffer *)stream->data;
  if (nread < 1) {
    if (nread < 0) {
      local_48._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(this->EndFunction_).super__Function_base._M_functor;
      local_48._8_8_ =
           *(undefined8 *)((long)&(this->EndFunction_).super__Function_base._M_functor + 8);
      *(undefined8 *)&(this->EndFunction_).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(this->EndFunction_).super__Function_base._M_functor + 8) = 0;
      p_Var1 = (this->EndFunction_).super__Function_base._M_manager;
      (this->EndFunction_).super__Function_base._M_manager = (_Manager_type)0x0;
      p_Var2 = (this->EndFunction_)._M_invoker;
      (this->EndFunction_)._M_invoker = (_Invoker_type)0x0;
      local_38 = p_Var1;
      local_30 = p_Var2;
      reset(this);
      local_20 = 0;
      if (nread != -0xfff) {
        local_20 = nread;
      }
      if (p_Var1 == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*p_Var2)(&local_48,&local_20);
      if (local_38 != (_Manager_type)0x0) {
        (*local_38)(&local_48,&local_48,__destroy_functor);
      }
    }
  }
  else {
    local_48._M_unused._M_object = buf->base;
    if ((char *)local_48._M_unused._0_8_ != (char *)0x0) {
      local_48._8_8_ = (long)local_48._M_unused._0_8_ + nread;
      if ((this->DataFunction_).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->DataFunction_)._M_invoker)
                ((_Any_data *)&this->DataFunction_,(cmRange<const_char_*> *)&local_48);
    }
  }
  return;
}

Assistant:

void cmUVPipeBuffer::UVData(uv_stream_t* stream, ssize_t nread,
                            const uv_buf_t* buf)
{
  auto& pipe = *reinterpret_cast<cmUVPipeBuffer*>(stream->data);
  if (nread > 0) {
    if (buf->base != nullptr) {
      // Call data function
      pipe.DataFunction_(DataRange(buf->base, buf->base + nread));
    }
  } else if (nread < 0) {
    // Save the end function on the stack before resetting the pipe
    EndFunction efunc;
    efunc.swap(pipe.EndFunction_);
    // Reset pipe before calling the end function
    pipe.reset();
    // Call end function
    efunc((nread == UV_EOF) ? 0 : nread);
  }
}